

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzePostModify(ExpressionContext *ctx,SynPostModify *syntax)

{
  uint uVar1;
  VariableData *pVVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  ExprGetAddress *expr;
  undefined4 extraout_var;
  TypeRef *type;
  VariableHandle *variable;
  ExprBase *pEVar6;
  TypeBase *pTVar7;
  undefined4 extraout_var_02;
  TypeBase *pTVar8;
  ExprError *pEVar9;
  undefined1 uVar10;
  char *pcVar11;
  ExprDereference *node;
  ExprGetAddress *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  expr = (ExprGetAddress *)AnalyzeExpression(ctx,syntax->value);
  pTVar8 = (expr->super_ExprBase).type;
  if ((pTVar8 == (TypeBase *)0x0) || (pTVar8->typeID != 0)) {
    uVar1 = (expr->super_ExprBase).typeID;
    if (uVar1 == 0x16) {
      this = (ExprGetAddress *)expr->variable;
    }
    else {
      this = expr;
      if (uVar1 == 0x22) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        this = (ExprGetAddress *)CONCAT44(extraout_var,iVar5);
        type = ExpressionContext::GetReferenceType(ctx,(expr->super_ExprBase).type);
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        variable = (VariableHandle *)CONCAT44(extraout_var_00,iVar5);
        pVVar2 = (VariableData *)expr->variable;
        variable->source = (expr->super_ExprBase).source;
        variable->variable = pVVar2;
        variable->next = (VariableHandle *)0x0;
        variable->listed = false;
        ExprGetAddress::ExprGetAddress(this,&syntax->super_SynBase,&type->super_TypeBase,variable);
      }
    }
    AssertValueExpression(ctx,&syntax->super_SynBase,(ExprBase *)expr);
    pTVar8 = (this->super_ExprBase).type;
    if ((pTVar8 == (TypeBase *)0x0) || (pTVar8->typeID != 0x12)) {
      pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pTVar8 = (expr->super_ExprBase).type;
      pEVar9 = anon_unknown.dwarf_1117a3::ReportExpected
                         (ctx,&syntax->super_SynBase,pTVar7,
                          "ERROR: cannot change immutable value of type %.*s",
                          (ulong)(uint)(*(int *)&(pTVar8->name).end - (int)(pTVar8->name).begin));
      return &pEVar9->super_ExprBase;
    }
    bVar4 = ExpressionContext::IsNumericType(ctx,(expr->super_ExprBase).type);
    if (!bVar4) {
      pTVar8 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pcVar11 = "decrement";
      if (syntax->isIncrement != false) {
        pcVar11 = "increment";
      }
      pTVar7 = (expr->super_ExprBase).type;
      pcVar3 = (pTVar7->name).begin;
      pEVar9 = anon_unknown.dwarf_1117a3::ReportExpected
                         (ctx,&syntax->super_SynBase,pTVar8,"ERROR: %s is not supported on \'%.*s\'"
                          ,pcVar11,(ulong)(uint)(*(int *)&(pTVar7->name).end - (int)pcVar3),pcVar3);
      return &pEVar9->super_ExprBase;
    }
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_01,iVar5);
    pTVar8 = (expr->super_ExprBase).type;
    uVar10 = syntax->isIncrement;
    pEVar6->typeID = 0x11;
    pEVar6->source = &syntax->super_SynBase;
    pEVar6->type = pTVar8;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e67f0;
    pEVar6[1]._vptr_ExprBase = (_func_int **)this;
  }
  else {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_02,iVar5);
    pTVar8 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    uVar10 = syntax->isIncrement;
    pEVar6->typeID = 0x10;
    pEVar6->source = &syntax->super_SynBase;
    pEVar6->type = pTVar8;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e67b8;
    pEVar6[1]._vptr_ExprBase = (_func_int **)expr;
  }
  *(undefined1 *)&pEVar6[1].typeID = uVar10;
  return pEVar6;
}

Assistant:

ExprBase* AnalyzePostModify(ExpressionContext &ctx, SynPostModify *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprPreModify>()) ExprPreModify(syntax, ctx.GetErrorType(), value, syntax->isIncrement);

	ExprBase* wrapped = value;

	if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(syntax, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	else if(ExprDereference *node = getType<ExprDereference>(value))
		wrapped = node->value;

	AssertValueExpression(ctx, syntax, value);

	if(!isType<TypeRef>(wrapped->type))
		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot change immutable value of type %.*s", FMT_ISTR(value->type->name));

	if(!ctx.IsNumericType(value->type))
		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: %s is not supported on '%.*s'", (syntax->isIncrement ? "increment" : "decrement"), FMT_ISTR(value->type->name));

	return new (ctx.get<ExprPostModify>()) ExprPostModify(syntax, value->type, wrapped, syntax->isIncrement);
}